

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_5450::TlbExportVisitor::visit_(TlbExportVisitor *this,NullType *type)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  string local_60;
  string local_40;
  
  poVar1 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<null ",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," name=\"",7);
  Typelib::Type::getName_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&local_40,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  auVar2 = Typelib::Type::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
            (&local_60,auVar2._0_8_,auVar2._8_8_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</null>",7);
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (NullType const& type)
    {
        m_stream << "<null " << " name=\"" << type.getName() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</null>";
        return true;
    }